

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O3

void __thiscall wasm_global_t::wasm_global_t(wasm_global_t *this,RefPtr<wabt::interp::Global> *ptr)

{
  RefPtr<wabt::interp::Extern> local_28;
  
  local_28.obj_ = &ptr->obj_->super_Extern;
  local_28.store_ = ptr->store_;
  if (local_28.store_ == (Store *)0x0) {
    local_28.root_index_ = 0;
  }
  else {
    local_28.root_index_ = wabt::interp::Store::CopyRoot(local_28.store_,ptr->root_index_);
  }
  wasm_extern_t::wasm_extern_t(&this->super_wasm_extern_t,&local_28);
  if ((Global *)local_28.obj_ != (Global *)0x0) {
    wabt::interp::Store::DeleteRoot(local_28.store_,local_28.root_index_);
  }
  return;
}

Assistant:

wasm_global_t(RefPtr<Global> ptr) : wasm_extern_t(ptr) {}